

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

int __thiscall units::detail::unit_data::unit_type_count(unit_data *this)

{
  unit_data uVar1;
  
  uVar1 = *this;
  return ((((((((((uint)(((uint)uVar1 & 0xf) != 0) - (uint)(((uint)uVar1 & 0xf0) == 0)) -
                (uint)(((uint)uVar1 & 0x700) == 0)) - (uint)(((uint)uVar1 & 0x3800) == 0)) -
              (uint)(((uint)uVar1 & 0xc000) == 0)) - (uint)(((uint)uVar1 & 0x70000) == 0)) -
            (uint)(((uint)uVar1 & 0x180000) == 0)) + 9) - (uint)(((uint)uVar1 & 0xe00000) == 0)) -
         (uint)(((uint)uVar1 & 0x3000000) == 0)) - (uint)(((uint)uVar1 & 0xc000000) == 0);
}

Assistant:

constexpr int unit_type_count() const
        {
            return ((meter_ != 0) ? 1 : 0) + ((second_ != 0) ? 1 : 0) +
                ((kilogram_ != 0) ? 1 : 0) + ((ampere_ != 0) ? 1 : 0) +
                ((candela_ != 0) ? 1 : 0) + ((kelvin_ != 0) ? 1 : 0) +
                ((mole_ != 0) ? 1 : 0) + ((radians_ != 0) ? 1 : 0) +
                ((currency_ != 0) ? 1 : 0) + ((count_ != 0) ? 1 : 0);
        }